

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O3

bool __thiscall
lambertian::scatter(lambertian *this,ray *r_in,hit_record *rec,color *attenuation,ray *scattered)

{
  double dVar1;
  element_type *peVar2;
  double dVar3;
  bool bVar4;
  uint uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined4 uVar9;
  int iVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  vec3 p;
  double local_48;
  double dStack_40;
  double local_38;
  
  uVar9 = SUB84(attenuation,0);
  vec3::random();
  uVar11 = SUB84(local_38,0);
  uVar12 = (undefined4)((ulong)local_38 >> 0x20);
  dVar15 = local_38 * local_38 + local_48 * local_48 + dStack_40 * dStack_40;
  while ((dVar15 <= 1e-160 || (1.0 < dVar15))) {
    vec3::random();
    uVar11 = SUB84(local_38,0);
    uVar12 = (undefined4)((ulong)local_38 >> 0x20);
    dVar15 = local_38 * local_38 + local_48 * local_48 + dStack_40 * dStack_40;
  }
  dVar13 = 1.0 / SQRT(dVar15);
  dVar15 = (rec->normal).e[2];
  dVar3 = (double)CONCAT44(uVar12,uVar11) * dVar13 + dVar15;
  bVar4 = ABS(dVar3) < 1e-08;
  dVar1 = r_in->tm;
  dVar6 = (rec->normal).e[0];
  dVar7 = (rec->normal).e[1];
  dVar14 = dVar13 * local_48 + dVar6;
  dVar13 = dVar13 * dStack_40 + dVar7;
  auVar16._8_8_ = -(ulong)(ABS(dVar13) < 1e-08);
  auVar16._0_8_ = -(ulong)(ABS(dVar14) < 1e-08);
  iVar10 = movmskpd(uVar9,auVar16);
  uVar5 = (uint)(iVar10 == 3 && bVar4);
  auVar17._0_8_ = CONCAT44((int)(uVar5 << 0x1f) >> 0x1f,(int)(uVar5 << 0x1f) >> 0x1f);
  auVar17._8_4_ = (int)(uVar5 << 0x1f) >> 0x1f;
  auVar17._12_4_ = (int)(uVar5 << 0x1f) >> 0x1f;
  if (iVar10 != 3 || !bVar4) {
    dVar15 = dVar3;
  }
  dVar3 = (rec->p).e[0];
  dVar8 = (rec->p).e[1];
  (scattered->orig).e[2] = (rec->p).e[2];
  (scattered->orig).e[0] = dVar3;
  (scattered->orig).e[1] = dVar8;
  (scattered->dir).e[0] = (double)(~auVar17._0_8_ & (ulong)dVar14 | (ulong)dVar6 & auVar17._0_8_);
  (scattered->dir).e[1] = (double)(~auVar17._8_8_ & (ulong)dVar13 | (ulong)dVar7 & auVar17._8_8_);
  (scattered->dir).e[2] = dVar15;
  scattered->tm = dVar1;
  peVar2 = (this->tex).super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar2->_vptr_texture[2])(SUB84(rec->u,0),rec->v,&local_48,peVar2,rec);
  attenuation->e[2] = local_38;
  attenuation->e[0] = local_48;
  attenuation->e[1] = dStack_40;
  return true;
}

Assistant:

bool scatter(const ray& r_in, const hit_record& rec, color& attenuation, ray& scattered)
    const override {
        auto scatter_direction = rec.normal + random_unit_vector();

        // Catch degenerate scatter direction
        if (scatter_direction.near_zero())
            scatter_direction = rec.normal;

        scattered = ray(rec.p, scatter_direction, r_in.time());
        attenuation = tex->value(rec.u, rec.v, rec.p);
        return true;
    }